

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

MOJOSHADER_glProgram *
MOJOSHADER_glLinkProgram(MOJOSHADER_glShader *vshader,MOJOSHADER_glShader *pshader)

{
  uint uVar1;
  MOJOSHADER_parseData *pMVar2;
  int *piVar3;
  MOJOSHADER_glContext *pMVar4;
  GLuint GVar5;
  int iVar6;
  MOJOSHADER_glProgram *program;
  UniformMap *__s;
  AttributeMap *pAVar7;
  long lVar8;
  uint uVar9;
  MOJOSHADER_attribute *pMVar10;
  long lVar11;
  size_t __n;
  int bound;
  int local_48;
  GLuint local_44;
  AttributeMap *local_40;
  GLint (*local_38) [10];
  
  local_48 = 0;
  if (vshader == (MOJOSHADER_glShader *)0x0 && pshader == (MOJOSHADER_glShader *)0x0) {
    return (MOJOSHADER_glProgram *)0x0;
  }
  GVar5 = (*ctx->profileLinkProgram)(vshader,pshader);
  if (GVar5 != 0) {
    program = (MOJOSHADER_glProgram *)(*ctx->malloc_fn)(0x2e8,ctx->malloc_data);
    if (program != (MOJOSHADER_glProgram *)0x0) {
      uVar9 = 0;
      memset(program,0,0x2e8);
      local_38 = program->vertex_attrib_loc;
      memset(local_38,0xff,0x230);
      if (vshader != (MOJOSHADER_glShader *)0x0) {
        uVar9 = vshader->parseData->uniform_count;
      }
      if (pshader != (MOJOSHADER_glShader *)0x0) {
        uVar9 = uVar9 + pshader->parseData->uniform_count;
      }
      if (0 < (int)uVar9) {
        __s = (UniformMap *)(*ctx->malloc_fn)((int)((ulong)uVar9 * 0x18),ctx->malloc_data);
        if (__s == (UniformMap *)0x0) {
          builtin_strncpy(error_buffer + 8,"emory",6);
          builtin_strncpy(error_buffer,"out of m",8);
          program->uniforms = (UniformMap *)0x0;
          goto LAB_0012369c;
        }
        program->uniforms = __s;
        memset(__s,0,(ulong)uVar9 * 0x18);
      }
      program->handle = GVar5;
      program->vertex = vshader;
      program->fragment = pshader;
      pMVar4 = ctx;
      program->generation = ctx->generation - 1;
      program->refcount = 1;
      if (vshader != (MOJOSHADER_glShader *)0x0) {
        lVar11 = (long)vshader->parseData->attribute_count;
        if (0 < lVar11) {
          __n = lVar11 << 4;
          pAVar7 = (AttributeMap *)(*pMVar4->malloc_fn)((int)__n,pMVar4->malloc_data);
          if (pAVar7 == (AttributeMap *)0x0) {
            builtin_strncpy(error_buffer + 8,"emory",6);
            builtin_strncpy(error_buffer,"out of m",8);
          }
          program->attributes = pAVar7;
          if (pAVar7 == (AttributeMap *)0x0) goto LAB_0012369c;
          local_44 = GVar5;
          local_40 = pAVar7;
          memset(pAVar7,0,__n);
          pMVar2 = program->vertex->parseData;
          if (0 < pMVar2->attribute_count) {
            pMVar10 = pMVar2->attributes;
            lVar11 = 0;
            do {
              uVar9 = (*ctx->profileGetAttribLocation)(program,(int)lVar11);
              if (-1 < (int)uVar9) {
                pAVar7 = program->attributes;
                uVar1 = program->attribute_count;
                pAVar7[uVar1].attribute = pMVar10;
                pAVar7[uVar1].location = uVar9;
                local_38[pMVar10->usage][pMVar10->index] = uVar9;
                program->attribute_count = program->attribute_count + 1;
                if (0x20 < uVar9) {
                  __assert_fail("0 && \"Static array is too small.\"",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                                ,0x71f,"int lookup_attributes(MOJOSHADER_glProgram *)");
                }
              }
              lVar11 = lVar11 + 1;
              pMVar10 = pMVar10 + 1;
            } while (lVar11 < pMVar2->attribute_count);
          }
          GVar5 = local_44;
          if (local_40 == (AttributeMap *)0x0) goto LAB_0012369c;
        }
        iVar6 = lookup_uniforms(program,vshader,&local_48);
        if (iVar6 == 0) goto LAB_0012369c;
        lookup_samplers(program,vshader,&local_48);
        if (pshader != (MOJOSHADER_glShader *)0x0) {
          lVar11 = (long)pshader->parseData->output_count;
          if (0 < lVar11) {
            lVar8 = 0;
            do {
              if (*(int *)((long)&pshader->parseData->outputs->usage + lVar8) == 4) {
                program->uses_pointsize = 1;
                break;
              }
              lVar8 = lVar8 + 0x10;
            } while (lVar11 * 0x10 != lVar8);
          }
        }
        vshader->refcount = vshader->refcount + 1;
      }
      if (pshader == (MOJOSHADER_glShader *)0x0) {
LAB_001239c9:
        if (0 < (long)(int)program->uniform_count) {
          lVar11 = 0;
          do {
            piVar3 = *(int **)((long)&program->uniforms->uniform + lVar11);
            if (piVar3[3] != 0) {
              __assert_fail("!u->constant",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                            ,0x736,"int build_constants_lists(MOJOSHADER_glProgram *)");
            }
            if ((piVar3[2] != 0) && (*piVar3 != 0)) {
              __assert_fail("u->type == MOJOSHADER_UNIFORM_FLOAT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                            ,0x73c,"int build_constants_lists(MOJOSHADER_glProgram *)");
            }
            lVar11 = lVar11 + 0x18;
          } while ((long)(int)program->uniform_count * 0x18 != lVar11);
        }
        if (local_48 != 0) {
          (*ctx->profileUseProgram)(ctx->bound_program);
        }
        (*ctx->profileFinalInitProgram)(program);
        return program;
      }
      iVar6 = lookup_uniforms(program,pshader,&local_48);
      if (iVar6 != 0) {
        lookup_samplers(program,pshader,&local_48);
        lVar11 = (long)pshader->parseData->output_count;
        if (0 < lVar11) {
          lVar8 = 0;
          do {
            if (*(int *)((long)&pshader->parseData->outputs->usage + lVar8) == 4) {
              program->uses_pointsize = 1;
              break;
            }
            lVar8 = lVar8 + 0x10;
          } while (lVar11 * 0x10 != lVar8);
        }
        pshader->refcount = pshader->refcount + 1;
        goto LAB_001239c9;
      }
      goto LAB_0012369c;
    }
    builtin_strncpy(error_buffer + 8,"emory",6);
    builtin_strncpy(error_buffer,"out of m",8);
  }
  program = (MOJOSHADER_glProgram *)0x0;
LAB_0012369c:
  if (program != (MOJOSHADER_glProgram *)0x0) {
    if (program->vs_uniforms_float4 != (GLfloat *)0x0) {
      (*ctx->free_fn)(program->vs_uniforms_float4,ctx->malloc_data);
    }
    if (program->vs_uniforms_int4 != (GLint *)0x0) {
      (*ctx->free_fn)(program->vs_uniforms_int4,ctx->malloc_data);
    }
    if (program->vs_uniforms_bool != (GLint *)0x0) {
      (*ctx->free_fn)(program->vs_uniforms_bool,ctx->malloc_data);
    }
    if (program->ps_uniforms_float4 != (GLfloat *)0x0) {
      (*ctx->free_fn)(program->ps_uniforms_float4,ctx->malloc_data);
    }
    if (program->ps_uniforms_int4 != (GLint *)0x0) {
      (*ctx->free_fn)(program->ps_uniforms_int4,ctx->malloc_data);
    }
    if (program->ps_uniforms_bool != (GLint *)0x0) {
      (*ctx->free_fn)(program->ps_uniforms_bool,ctx->malloc_data);
    }
    if (program->uniforms != (UniformMap *)0x0) {
      (*ctx->free_fn)(program->uniforms,ctx->malloc_data);
    }
    if (program->attributes != (AttributeMap *)0x0) {
      (*ctx->free_fn)(program->attributes,ctx->malloc_data);
    }
    (*ctx->free_fn)(program,ctx->malloc_data);
  }
  if (GVar5 != 0) {
    (*ctx->profileDeleteProgram)(GVar5);
  }
  if (local_48 != 0) {
    (*ctx->profileUseProgram)(ctx->bound_program);
  }
  return (MOJOSHADER_glProgram *)0x0;
}

Assistant:

MOJOSHADER_glProgram *MOJOSHADER_glLinkProgram(MOJOSHADER_glShader *vshader,
                                               MOJOSHADER_glShader *pshader)
{
    int bound = 0;

    if ((vshader == NULL) && (pshader == NULL))
        return NULL;

    int numregs = 0;
    MOJOSHADER_glProgram *retval = NULL;
    const GLuint program = ctx->profileLinkProgram(vshader, pshader);
    if (program == 0)
        goto link_program_fail;

    retval = (MOJOSHADER_glProgram *) Malloc(sizeof (MOJOSHADER_glProgram));
    if (retval == NULL)
        goto link_program_fail;
    memset(retval, '\0', sizeof (MOJOSHADER_glProgram));
    memset(retval->vertex_attrib_loc, 0xFF, sizeof(retval->vertex_attrib_loc));

    numregs = 0;
    if (vshader != NULL) numregs += vshader->parseData->uniform_count;
    if (pshader != NULL) numregs += pshader->parseData->uniform_count;
    if (numregs > 0)
    {
        const size_t len = sizeof (UniformMap) * numregs;
        retval->uniforms = (UniformMap *) Malloc(len);
        if (retval->uniforms == NULL)
            goto link_program_fail;
        memset(retval->uniforms, '\0', len);
    } // if

    retval->handle = program;
    retval->vertex = vshader;
    retval->fragment = pshader;
    retval->generation = ctx->generation - 1;
    retval->refcount = 1;

    if (vshader != NULL)
    {
        if (vshader->parseData->attribute_count > 0)
        {
            const int count = vshader->parseData->attribute_count;
            const size_t len = sizeof (AttributeMap) * count;
            retval->attributes = (AttributeMap *) Malloc(len);
            if (retval->attributes == NULL)
                goto link_program_fail;

            memset(retval->attributes, '\0', len);
            if (!lookup_attributes(retval))
                goto link_program_fail;
        } // if

        if (!lookup_uniforms(retval, vshader, &bound))
            goto link_program_fail;
        lookup_samplers(retval, vshader, &bound);
        lookup_outputs(retval, pshader);
        vshader->refcount++;
    } // if

    if (pshader != NULL)
    {
        if (!lookup_uniforms(retval, pshader, &bound))
            goto link_program_fail;
        lookup_samplers(retval, pshader, &bound);
        lookup_outputs(retval, pshader);
        pshader->refcount++;
    } // if

    if (!build_constants_lists(retval))
        goto link_program_fail;

    if (bound)  // reset the old binding.
        ctx->profileUseProgram(ctx->bound_program);

    ctx->profileFinalInitProgram(retval);

    return retval;

link_program_fail:
    if (retval != NULL)
    {
        Free(retval->vs_uniforms_float4);
        Free(retval->vs_uniforms_int4);
        Free(retval->vs_uniforms_bool);
        Free(retval->ps_uniforms_float4);
        Free(retval->ps_uniforms_int4);
        Free(retval->ps_uniforms_bool);
        Free(retval->uniforms);
        Free(retval->attributes);
        Free(retval);
    } // if

    if (program != 0)
        ctx->profileDeleteProgram(program);

    if (bound)
        ctx->profileUseProgram(ctx->bound_program);

    return NULL;
}